

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LessEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lessequal(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x33b) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x33b;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LessEqualLayerParams::LessEqualLayerParams(this_00.lessequal_);
    (this->layer_).lessequal_ = (LessEqualLayerParams *)this_00;
  }
  return (LessEqualLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LessEqualLayerParams* NeuralNetworkLayer::mutable_lessequal() {
  if (!has_lessequal()) {
    clear_layer();
    set_has_lessequal();
    layer_.lessequal_ = new ::CoreML::Specification::LessEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lessEqual)
  return layer_.lessequal_;
}